

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  uint uVar1;
  int iVar2;
  string *in_RDI;
  bool bVar3;
  allocator local_2739;
  random_device seed_gen;
  mt19937 engine;
  
  std::random_device::random_device(&seed_gen);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&engine,(ulong)uVar1);
  std::__cxx11::string::string((string *)in_RDI,"--cpp-httplib-multipart-data-",&local_2739);
  iVar2 = 0x10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::operator()(&engine);
    std::__cxx11::string::push_back((char)in_RDI);
  }
  std::random_device::~random_device(&seed_gen);
  return in_RDI;
}

Assistant:

inline std::string make_multipart_data_boundary() {
  static const char data[] =
      "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  std::string result = "--cpp-httplib-multipart-data-";

  for (auto i = 0; i < 16; i++) {
    result += data[engine() % (sizeof(data) - 1)];
  }

  return result;
}